

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcp.cc
# Opt level: O2

void __thiscall XcpOptions::Init(XcpOptions *this,int argc,char **argv)

{
  int *piVar1;
  int iVar2;
  string *psVar3;
  int iVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  allocator local_9e;
  allocator local_9d;
  int local_9c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  common::Options::Init(&this->super_Options,argc,argv);
  iVar2 = (this->super_Options).opt_cur;
  iVar4 = iVar2 + 2;
  if (argc < iVar2 + 2) {
    iVar4 = argc;
  }
  local_78 = (string *)&this->local_path;
  local_80 = (string *)&this->remote_path;
  local_9c = iVar2;
  while (iVar2 < iVar4) {
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_50,argv[iVar2],&local_9d);
    std::__cxx11::string::string((string *)&local_70,":",&local_9e);
    xlib::Split(&local_50,&local_70,&local_98);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    psVar3 = local_78;
    if ((long)local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      if (local_9c == (this->super_Options).opt_cur) {
        this->remote_to_local = true;
      }
      else {
        this->local_to_remote = true;
      }
      common::Options::ParseHosts
                (&this->super_Options,
                 local_98.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      psVar3 = local_80;
    }
    std::__cxx11::string::_M_assign(psVar3);
    piVar1 = &(this->super_Options).opt_cur;
    *piVar1 = *piVar1 + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    iVar2 = (this->super_Options).opt_cur;
  }
  return;
}

Assistant:

void Init(int argc, char **argv) {
        common::Options::Init(argc, argv);
        int pre = opt_cur;
        while ( opt_cur < argc && (pre + 2)>opt_cur ) {
            std::vector<std::string> vec;
            xlib::Split(argv[opt_cur], ":", &vec);
            if (vec.size() == 2) {
                (pre == opt_cur) ? remote_to_local = true : local_to_remote = true;
                common::Options::ParseHosts(vec[0]);
                remote_path = vec[1];
            } else {
                local_path = vec[0];
            }
            opt_cur++;
        }
    }